

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O0

QString * QLocalTime::localTimeAbbbreviationAt(qint64 local,TransitionOptions resolve)

{
  long lVar1;
  char **in_RSI;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView in_stack_00000000;
  MkTimeResult use;
  TransitionOptions in_stack_000000ec;
  QByteArrayView *this;
  undefined1 local_50 [12];
  int in_stack_ffffffffffffffbc;
  long local_20;
  byte local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  memset(local_50,0xaa,0x48);
  QRoundingDown::qDiv<1000u,long_long>((longlong)in_RDI);
  anon_unknown.dwarf_be34e2::resolveLocalTime(local,in_stack_000000ec);
  if ((local_10 & 1) == 0) {
    QString::QString((QString *)0x57c3dd);
  }
  else if (local_20 == 0) {
    qTzName(in_stack_ffffffffffffffbc);
  }
  else {
    QByteArrayView::QByteArrayView<const_char_*,_true>(this,in_RSI);
    QString::fromLocal8Bit(in_stack_00000000);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString localTimeAbbbreviationAt(qint64 local, QDateTimePrivate::TransitionOptions resolve)
{
    auto use = resolveLocalTime(QRoundingDown::qDiv<MSECS_PER_SEC>(local), resolve);
    if (!use.good)
        return {};
#ifdef HAVE_TM_ZONE
    if (use.local.tm_zone)
        return QString::fromLocal8Bit(use.local.tm_zone);
#endif
    return qTzName(use.local.tm_isdst > 0 ? 1 : 0);
}